

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void ImPlot::RenderMarkers<ImPlot::TransformerLogLog,ImPlot::GetterYs<float>>
               (GetterYs<float> getter,TransformerLogLog transformer,ImDrawList *DrawList,
               ImPlotMarker marker,float size,bool rend_mk_line,ImU32 col_mk_line,float weight,
               bool rend_mk_fill,ImU32 col_mk_fill)

{
  ImPlotPlot *pIVar1;
  ImPlotContext *pIVar2;
  int iVar3;
  float fVar4;
  double dVar5;
  double dVar6;
  ImVec2 c;
  ImVec2 local_a8;
  uint local_9c;
  uint local_98;
  float local_94;
  ImU32 local_90;
  float local_8c;
  long local_88;
  ImDrawList *local_80;
  long local_78;
  ulong local_70;
  float *local_68;
  double local_60;
  double local_58;
  ImPlotContext *local_50;
  double local_48;
  double local_40;
  double local_38;
  
  if (0 < getter.Count) {
    local_50 = GImPlot;
    local_58 = getter.X0;
    local_60 = getter.XScale;
    local_68 = getter.Ys;
    local_70 = (ulong)(uint)getter.Offset;
    local_78 = (long)getter.Stride;
    local_88 = (long)marker;
    iVar3 = 0;
    local_38 = 0.0;
    local_98 = (uint)rend_mk_line;
    local_9c = (uint)rend_mk_fill;
    local_94 = size;
    local_90 = col_mk_line;
    local_8c = weight;
    local_80 = DrawList;
    do {
      pIVar2 = GImPlot;
      local_40 = (double)*(float *)((long)local_68 +
                                   ((((int)local_70 + iVar3) % getter.Count + getter.Count) %
                                   getter.Count) * local_78);
      dVar5 = log10((local_60 * local_38 + local_58) / (GImPlot->CurrentPlot->XAxis).Range.Min);
      pIVar1 = pIVar2->CurrentPlot;
      local_48 = (pIVar1->XAxis).Range.Min;
      local_48 = (double)(float)(dVar5 / pIVar2->LogDenX) * ((pIVar1->XAxis).Range.Max - local_48) +
                 local_48;
      dVar6 = log10(local_40 / pIVar1->YAxis[transformer.YAxis].Range.Min);
      pIVar1 = pIVar2->CurrentPlot;
      dVar5 = pIVar1->YAxis[transformer.YAxis].Range.Min;
      local_a8.x = (float)((local_48 - (pIVar1->XAxis).Range.Min) * pIVar2->Mx +
                          (double)pIVar2->PixelRange[transformer.YAxis].Min.x);
      fVar4 = (float)((((double)(float)(dVar6 / pIVar2->LogDenY[transformer.YAxis]) *
                        (pIVar1->YAxis[transformer.YAxis].Range.Max - dVar5) + dVar5) - dVar5) *
                      pIVar2->My[transformer.YAxis] +
                     (double)pIVar2->PixelRange[transformer.YAxis].Min.y);
      local_a8.y = fVar4;
      pIVar1 = local_50->CurrentPlot;
      if (((((pIVar1->PlotRect).Min.x <= local_a8.x) && ((pIVar1->PlotRect).Min.y <= fVar4)) &&
          (local_a8.x < (pIVar1->PlotRect).Max.x)) && (fVar4 < (pIVar1->PlotRect).Max.y)) {
        (*RenderMarkers<ImPlot::TransformerLogLog,_ImPlot::GetterYs<float>_>::marker_table[local_88]
        )(local_80,&local_a8,local_94,SUB41(local_98,0),local_90,SUB41(local_9c,0),col_mk_fill,
          local_8c);
      }
      local_38 = local_38 + 1.0;
      iVar3 = iVar3 + 1;
    } while (getter.Count != iVar3);
  }
  return;
}

Assistant:

inline void RenderMarkers(Getter getter, Transformer transformer, ImDrawList& DrawList, ImPlotMarker marker, float size, bool rend_mk_line, ImU32 col_mk_line, float weight, bool rend_mk_fill, ImU32 col_mk_fill) {
    static void (*marker_table[ImPlotMarker_COUNT])(ImDrawList&, const ImVec2&, float s, bool, ImU32, bool, ImU32, float) = {
        RenderMarkerCircle,
        RenderMarkerSquare,
        RenderMarkerDiamond ,
        RenderMarkerUp ,
        RenderMarkerDown ,
        RenderMarkerLeft,
        RenderMarkerRight,
        RenderMarkerCross,
        RenderMarkerPlus,
        RenderMarkerAsterisk
    };
    ImPlotContext& gp = *GImPlot;
    for (int i = 0; i < getter.Count; ++i) {
        ImVec2 c = transformer(getter(i));
        if (gp.CurrentPlot->PlotRect.Contains(c))
            marker_table[marker](DrawList, c, size, rend_mk_line, col_mk_line, rend_mk_fill, col_mk_fill, weight);
    }
}